

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s98ml_parse.c
# Opt level: O2

int yysyntax_error(long *yymsg_alloc,char **yymsg,yypcontext_t *yyctx)

{
  char cVar1;
  yysymbol_kind_t yVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  char *__s;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  char *yyres;
  int iVar11;
  long lVar12;
  yysymbol_kind_t yyarg [5];
  
  yVar2 = yyctx->yytoken;
  __s = "syntax error";
  uVar9 = 0;
  if (yVar2 == YYSYMBOL_YYEMPTY) {
    uVar8 = 0;
  }
  else {
    uVar10 = (ulong)*yyctx->yyssp;
    uVar8 = 1;
    yyarg[0] = yVar2;
    if ((0x5eabbf2c760dU >> (uVar10 & 0x3f) & 1) == 0) {
      iVar3 = (int)yypact[uVar10];
      iVar4 = 0;
      iVar11 = 0x18;
      if (0x26 - iVar3 < 0x18) {
        iVar11 = 0x26 - iVar3;
      }
      for (uVar10 = -(long)iVar3 & -(ulong)((0x5eebff2c767dU >> (uVar10 & 0x3f) & 1) != 0);
          (long)uVar10 < (long)iVar11; uVar10 = uVar10 + 1) {
        if ((uVar10 != 1) &&
           ((yysymbol_kind_t)uVar10 == (int)"\v\x10\x11\x12\x13\x14"[(long)iVar3 + uVar10])) {
          if (iVar4 == 4) {
            __s = "syntax error, unexpected %s";
            goto switchD_00103a7c_caseD_fffffffe;
          }
          lVar12 = (long)iVar4;
          iVar4 = iVar4 + 1;
          yyarg[lVar12 + 1] = (int)"\v\x10\x11\x12\x13\x14"[(long)iVar3 + uVar10];
        }
      }
      if (iVar4 == -2) {
        return -2;
      }
      if (iVar4 != 0) {
        uVar8 = iVar4 + 1;
        switch(iVar4) {
        case 1:
          __s = "syntax error, unexpected %s, expecting %s";
          uVar8 = 2;
          break;
        case 2:
          __s = "syntax error, unexpected %s, expecting %s or %s";
          uVar8 = 3;
          break;
        case 3:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s";
          uVar8 = 4;
          break;
        case 4:
          __s = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
          uVar8 = 5;
          break;
        case -3:
          return -2;
        }
        goto switchD_00103a7c_caseD_fffffffe;
      }
    }
    yyarg[1] = YYSYMBOL_YYEMPTY;
    __s = "syntax error, unexpected %s";
  }
switchD_00103a7c_caseD_fffffffe:
  sVar5 = strlen(__s);
  lVar12 = (sVar5 - (long)(int)(uVar8 * 2)) + 1;
  uVar10 = 0;
  if (0 < (int)uVar8) {
    uVar10 = (ulong)uVar8;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    lVar6 = yytnamerr((char *)0x0,yytname[yyarg[uVar9]]);
    if (lVar6 < 0) {
      return -2;
    }
    lVar12 = lVar12 + lVar6;
  }
  if (*yymsg_alloc < lVar12) {
    lVar6 = lVar12 * 2;
    lVar7 = 0x7fffffffffffffff;
    if (lVar12 == lVar6 || SBORROW8(lVar12,lVar6) != 0 < lVar12) {
      lVar7 = lVar6;
    }
    *yymsg_alloc = lVar7;
    return -1;
  }
  yyres = *yymsg;
  iVar11 = 0;
  lVar12 = 1;
  do {
    cVar1 = *__s;
    *yyres = cVar1;
    lVar6 = lVar12;
    lVar7 = lVar12;
    if (cVar1 == '%') {
      if ((__s[1] == 's') && (iVar11 < (int)uVar8)) {
        lVar6 = (long)iVar11;
        iVar11 = iVar11 + 1;
        lVar6 = yytnamerr(yyres,yytname[yyarg[lVar6]]);
        lVar7 = 2;
      }
    }
    else if (cVar1 == '\0') {
      return 0;
    }
    yyres = yyres + lVar6;
    __s = __s + lVar7;
  } while( true );
}

Assistant:

static int
yysyntax_error (YYPTRDIFF_T *yymsg_alloc, char **yymsg,
                const yypcontext_t *yyctx)
{
  enum { YYARGS_MAX = 5 };
  /* Internationalized format string. */
  const char *yyformat = YY_NULLPTR;
  /* Arguments of yyformat: reported tokens (one for the "unexpected",
     one per "expected"). */
  yysymbol_kind_t yyarg[YYARGS_MAX];
  /* Cumulated lengths of YYARG.  */
  YYPTRDIFF_T yysize = 0;

  /* Actual size of YYARG. */
  int yycount = yy_syntax_error_arguments (yyctx, yyarg, YYARGS_MAX);
  if (yycount == YYENOMEM)
    return YYENOMEM;

  switch (yycount)
    {
#define YYCASE_(N, S)                       \
      case N:                               \
        yyformat = S;                       \
        break
    default: /* Avoid compiler warnings. */
      YYCASE_(0, YY_("syntax error"));
      YYCASE_(1, YY_("syntax error, unexpected %s"));
      YYCASE_(2, YY_("syntax error, unexpected %s, expecting %s"));
      YYCASE_(3, YY_("syntax error, unexpected %s, expecting %s or %s"));
      YYCASE_(4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
      YYCASE_(5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
    }

  /* Compute error message size.  Don't count the "%s"s, but reserve
     room for the terminator.  */
  yysize = yystrlen (yyformat) - 2 * yycount + 1;
  {
    int yyi;
    for (yyi = 0; yyi < yycount; ++yyi)
      {
        YYPTRDIFF_T yysize1
          = yysize + yytnamerr (YY_NULLPTR, yytname[yyarg[yyi]]);
        if (yysize <= yysize1 && yysize1 <= YYSTACK_ALLOC_MAXIMUM)
          yysize = yysize1;
        else
          return YYENOMEM;
      }
  }

  if (*yymsg_alloc < yysize)
    {
      *yymsg_alloc = 2 * yysize;
      if (! (yysize <= *yymsg_alloc
             && *yymsg_alloc <= YYSTACK_ALLOC_MAXIMUM))
        *yymsg_alloc = YYSTACK_ALLOC_MAXIMUM;
      return -1;
    }

  /* Avoid sprintf, as that infringes on the user's name space.
     Don't have undefined behavior even if the translation
     produced a string with the wrong number of "%s"s.  */
  {
    char *yyp = *yymsg;
    int yyi = 0;
    while ((*yyp = *yyformat) != '\0')
      if (*yyp == '%' && yyformat[1] == 's' && yyi < yycount)
        {
          yyp += yytnamerr (yyp, yytname[yyarg[yyi++]]);
          yyformat += 2;
        }
      else
        {
          ++yyp;
          ++yyformat;
        }
  }
  return 0;
}